

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,int leave,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,bool polish)

{
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Status SVar7;
  pointer pnVar8;
  undefined8 uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *to;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (leave < 0) goto LAB_002b3529;
  pSVar10 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pUVar2 = pSVar10->theFvec;
  pnVar8 = (pSVar10->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pnVar8[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN) ||
     (pnVar3 = (pSVar10->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pnVar3[(uint)leave].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002b347b:
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sel,0.0);
    if (polish) goto LAB_002b3529;
    pnVar8 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x20);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[(uint)leave].m_backend;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar8[(uint)leave].m_backend + 8);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x10);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x18);
    local_e8.m_backend.exp = *(int *)((long)(pnVar8 + (uint)leave) + 0x28);
    local_e8.m_backend.neg = *(bool *)((long)(pnVar8 + (uint)leave) + 0x2c);
    local_e8.m_backend._48_8_ = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x30);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound((this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver,leave,&local_e8);
    pSVar10 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar8 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x20);
    to = &local_128;
  }
  else {
    iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&pnVar8[(uint)leave].m_backend,&pnVar3[(uint)leave].m_backend);
    if (iVar6 < 1) goto LAB_002b347b;
    pnVar8 = (pUVar2->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pnVar8[(uint)leave].m_backend.data + 0x20);
    local_1a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[(uint)leave].m_backend.data;
    local_1a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar8[(uint)leave].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar8[(uint)leave].m_backend.data + 0x10);
    local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1a8.exp = pnVar8[(uint)leave].m_backend.exp;
    local_1a8.neg = pnVar8[(uint)leave].m_backend.neg;
    local_1a8.fpclass = pnVar8[(uint)leave].m_backend.fpclass;
    local_1a8.prec_elem = pnVar8[(uint)leave].m_backend.prec_elem;
    local_1e8.data._M_elems._32_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8);
    local_1e8.data._M_elems._0_8_ = *(undefined8 *)(this->fastDelta).m_backend.data._M_elems;
    local_1e8.data._M_elems._8_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2);
    local_1e8.data._M_elems._16_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4);
    local_1e8.data._M_elems._24_8_ = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6);
    local_1e8.exp = (this->fastDelta).m_backend.exp;
    local_1e8.neg = (this->fastDelta).m_backend.neg;
    local_1e8.fpclass = (this->fastDelta).m_backend.fpclass;
    local_1e8.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_1e8.fpclass != cpp_dec_float_finite || local_1e8.data._M_elems[0] != 0) {
      local_1e8.neg = (bool)(local_1e8.neg ^ 1);
    }
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 10;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems._24_5_ = 0;
    local_168.data._M_elems[7]._1_3_ = 0;
    local_168.data._M_elems._32_5_ = 0;
    local_168._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_168,&local_1e8,&maxabs->m_backend);
    if (((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_168.fpclass == cpp_dec_float_NaN))
    goto LAB_002b3529;
    iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&sel->m_backend,&local_168);
    if (-1 < iVar6) goto LAB_002b3529;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sel,0.0);
    if (polish) goto LAB_002b3529;
    pSVar10 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar10->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar10->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + (uint)leave);
    if (SVar7 == D_ON_BOTH) goto LAB_002b3529;
    if (local_1a8.fpclass != cpp_dec_float_NaN) {
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
      iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_1a8,&local_168);
      if (iVar6 < 0) {
        pnVar8 = (pUVar2->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x20);
        local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[(uint)leave].m_backend;
        local_68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar8[(uint)leave].m_backend + 8);
        local_68.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x10);
        local_68.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x18);
        local_68.m_backend.exp = *(int *)((long)(pnVar8 + (uint)leave) + 0x28);
        local_68.m_backend.neg = *(bool *)((long)(pnVar8 + (uint)leave) + 0x2c);
        local_68.m_backend._48_8_ = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x30);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftLBbound((this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver,leave,&local_68);
        goto LAB_002b3529;
      }
    }
    pSVar10 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar8 = (pUVar2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x20);
    to = &local_a8;
  }
  *(undefined8 *)((to->m_backend).data._M_elems + 8) = uVar9;
  uVar9 = *(undefined8 *)&pnVar8[(uint)leave].m_backend;
  uVar4 = *(undefined8 *)((long)&pnVar8[(uint)leave].m_backend + 8);
  uVar5 = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x18);
  *(undefined8 *)((to->m_backend).data._M_elems + 4) =
       *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x10);
  *(undefined8 *)((to->m_backend).data._M_elems + 6) = uVar5;
  *(undefined8 *)(to->m_backend).data._M_elems = uVar9;
  *(undefined8 *)((to->m_backend).data._M_elems + 2) = uVar4;
  (to->m_backend).exp = *(int *)((long)(pnVar8 + (uint)leave) + 0x28);
  (to->m_backend).neg = *(bool *)((long)(pnVar8 + (uint)leave) + 0x2c);
  uVar9 = *(undefined8 *)((long)(pnVar8 + (uint)leave) + 0x30);
  (to->m_backend).fpclass = (int)uVar9;
  (to->m_backend).prec_elem = (int)((ulong)uVar9 >> 0x20);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::shiftUBbound(pSVar10,leave,to);
LAB_002b3529:
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::maxReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            if(x < 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}